

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O3

void __thiscall HModel::util_reportModel(HModel *this)

{
  HModel *this_00;
  
  puts("util_reportModel");
  printf("Model %s has %d columns, %d rows and %d nonzeros\n",(this->modelName)._M_dataplus._M_p,
         (long)this->numCol,(ulong)(uint)this->numRow,
         (ulong)(uint)(this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[this->numCol]);
  this_00 = this;
  util_reportModelObjSense(this);
  if (100 < this->numTot) {
    return;
  }
  util_reportColVec(this_00,this->numCol,&this->colCost,&this->colLower,&this->colUpper);
  util_reportRowVec(this_00,this->numRow,&this->rowLower,&this->rowUpper);
  util_reportColMtx(this_00,this->numCol,&this->Astart,&this->Aindex,&this->Avalue);
  return;
}

Assistant:

void HModel::util_reportModel() {
#ifdef JAJH_dev
  printf("util_reportModel\n");
#endif
  util_reportModelDimensions();
  util_reportModelObjSense();
  if (numTot>100) return;
  util_reportColVec(numCol, colCost, colLower, colUpper);
  util_reportRowVec(numRow, rowLower, rowUpper);
  util_reportColMtx(numCol, Astart, Aindex, Avalue);
}